

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomButtonGroup::read(DomButtonGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomProperty *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar3;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_01;
  long lVar4;
  QList<DomProperty_*> *this_02;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_01 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  lVar4 = 0;
  pQVar3 = local_50.ptr;
  while( true ) {
    if (local_50.size * 0x68 == lVar4) break;
    local_68.m_data = *(storage_type_conflict **)(pQVar3 + 8);
    local_68.m_size = *(qsizetype *)(pQVar3 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"name",4);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar4 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeName(this,(QString *)&local_80);
    }
    else {
      local_98.a.m_size = 0x15;
      local_98.a.m_data = "Unexpected attribute ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_01);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar3 = pQVar3 + 0x68;
    lVar4 = lVar4 + 0x68;
  }
LAB_00153394:
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_01);
      if (bVar1) goto LAB_001534d8;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) break;
      if (iVar2 == 5) {
LAB_001534d8:
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(long *)(in_FS_OFFSET + 0x28);
      }
    }
    local_68.m_size = -0x5555555555555556;
    local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_68 = (QStringView)QXmlStreamReader::name();
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"property",8);
    __nbytes_00 = 0;
    other.m_data = local_80.ptr;
    other.m_size = local_80.size;
    iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    this_02 = &this->m_property;
    if (iVar2 != 0) {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"attribute",9);
      __nbytes_00 = 0;
      other_00.m_data = local_80.ptr;
      other_00.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      this_02 = &this->m_attribute;
      if (iVar2 != 0) {
        local_98.a.m_size = 0x13;
        local_98.a.m_data = "Unexpected element ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_01);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        goto LAB_00153394;
      }
    }
    this_00 = (DomProperty *)operator_new(0x178);
    memset(this_00,0,0x178);
    DomProperty::read(this_00,__fd,__buf_00,__nbytes_00);
    QList<DomProperty_*>::append(this_02,this_00);
  } while( true );
}

Assistant:

void DomButtonGroup::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}